

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

void synthetic_create_rec(stagewise_poly *poly,float v,uint64_t findex)

{
  byte bVar1;
  bool bVar2;
  uint64_t uVar3;
  stagewise_poly *in_RDI;
  float in_XMM0_Da;
  feature parent_f;
  feature temp;
  uint64_t wid_cur;
  uint64_t wid_atomic;
  uint64_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar4;
  uint uVar5;
  stagewise_poly *poly_00;
  undefined4 in_stack_ffffffffffffffb0;
  uint32_t uVar6;
  uint64_t in_stack_ffffffffffffffb8;
  undefined8 uVar7;
  stagewise_poly *in_stack_ffffffffffffffc0;
  stagewise_poly *in_stack_ffffffffffffffc8;
  uint64_t local_30;
  
  poly_00 = in_RDI;
  un_ft_offset(in_RDI,CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  wid_mask((stagewise_poly *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
           in_stack_ffffffffffffff98);
  uVar3 = child_wid(in_stack_ffffffffffffffc8,(uint64_t)in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffb8);
  uVar6 = in_RDI->cur_depth;
  bVar1 = min_depths_get((stagewise_poly *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),
                         (uint64_t)poly_00);
  if ((uVar6 < bVar1) && ((in_RDI->training & 1U) != 0)) {
    bVar2 = parent_get((stagewise_poly *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),(uint64_t)poly_00
                      );
    if (bVar2) {
      parent_toggle((stagewise_poly *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),(uint64_t)poly_00);
    }
    min_depths_set(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(uint8_t)(uVar6 >> 0x18));
  }
  bVar2 = cycle_get(poly_00,CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (!bVar2) {
    if (in_RDI->cur_depth < 0x80) {
      uVar4 = in_RDI->cur_depth;
    }
    else {
      uVar4 = 0x7f;
    }
    uVar5 = uVar4;
    bVar1 = min_depths_get((stagewise_poly *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),
                           (uint64_t)poly_00);
    if (uVar4 == bVar1) {
      cycle_toggle((stagewise_poly *)CONCAT44(uVar5,uVar4),in_stack_ffffffffffffff98);
      feature::feature((feature *)&stack0xffffffffffffffc8,in_XMM0_Da * (in_RDI->synth_rec_f).x,
                       uVar3);
      features::push_back((features *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),
                          (feature_value)((ulong)poly_00 >> 0x20),CONCAT44(uVar5,uVar4));
      (in_RDI->synth_ec).num_features = (in_RDI->synth_ec).num_features + 1;
      bVar2 = parent_get((stagewise_poly *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),
                         (uint64_t)poly_00);
      if (bVar2) {
        uVar7 = *(undefined8 *)&in_RDI->synth_rec_f;
        uVar3 = (in_RDI->synth_rec_f).weight_index;
        *(stagewise_poly **)&in_RDI->synth_rec_f = in_stack_ffffffffffffffc8;
        (in_RDI->synth_rec_f).weight_index = local_30;
        in_RDI->cur_depth = in_RDI->cur_depth + 1;
        GD::foreach_feature<stagewise_poly,_unsigned_long,_&synthetic_create_rec>
                  ((vw *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),(example *)poly_00,
                   (stagewise_poly *)CONCAT44(uVar5,uVar4));
        in_RDI->cur_depth = in_RDI->cur_depth - 1;
        *(undefined8 *)&in_RDI->synth_rec_f = uVar7;
        (in_RDI->synth_rec_f).weight_index = uVar3;
      }
    }
  }
  return;
}

Assistant:

void synthetic_create_rec(stagewise_poly &poly, float v, uint64_t findex)
{
  // Note: need to un_ft_shift since gd::foreach_feature bakes in the offset.
  uint64_t wid_atomic = wid_mask(poly, un_ft_offset(poly, findex));
  uint64_t wid_cur = child_wid(poly, wid_atomic, poly.synth_rec_f.weight_index);
  assert(wid_atomic % stride_shift(poly, 1) == 0);

  // Note: only mutate learner state when in training mode.  This is because
  // the average test errors across multiple data sets should be equal to
  // the test error on the merged dataset (which is violated if the code
  // below is run at training time).
  if (poly.cur_depth < min_depths_get(poly, wid_cur) && poly.training)
  {
    if (parent_get(poly, wid_cur))
    {
#ifdef DEBUG
      cout << "FOUND A TRANSPLANT!!! moving [" << wid_cur << "] from depth " << (uint64_t)min_depths_get(poly, wid_cur)
           << " to depth " << poly.cur_depth << endl;
#endif  // DEBUG
      // XXX arguably, should also fear transplants that occured with
      // a different ft_offset ; e.g., need to look out for cross-reduction
      // collisions.  Have not played with this issue yet...
      parent_toggle(poly, wid_cur);
    }
    min_depths_set(poly, wid_cur, poly.cur_depth);
  }

  if (!cycle_get(poly, wid_cur) &&
      ((poly.cur_depth > default_depth ? default_depth : poly.cur_depth) == min_depths_get(poly, wid_cur)))
  {
    cycle_toggle(poly, wid_cur);

#ifdef DEBUG
    ++poly.depths[poly.cur_depth];
#endif  // DEBUG

    feature temp = {v * poly.synth_rec_f.x, wid_cur};
    poly.synth_ec.feature_space[tree_atomics].push_back(temp.x, temp.weight_index);
    poly.synth_ec.num_features++;

    if (parent_get(poly, temp.weight_index))
    {
      feature parent_f = poly.synth_rec_f;
      poly.synth_rec_f = temp;
      ++poly.cur_depth;
#ifdef DEBUG
      poly.max_depth = (poly.max_depth > poly.cur_depth) ? poly.max_depth : poly.cur_depth;
#endif  // DEBUG
      GD::foreach_feature<stagewise_poly, uint64_t, synthetic_create_rec>(*(poly.all), *(poly.original_ec), poly);
      --poly.cur_depth;
      poly.synth_rec_f = parent_f;
    }
  }
}